

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txorphanage.cpp
# Opt level: O3

bool __thiscall TxOrphanage::AddTx(TxOrphanage *this,CTransactionRef *tx,NodeId peer)

{
  Wtxid *__k;
  pointer *pp_Var1;
  element_type *peVar2;
  CTransaction *tx_00;
  iterator __position;
  pointer pCVar3;
  int iVar4;
  string_view source_file;
  string_view source_file_00;
  bool bVar5;
  const_iterator cVar6;
  time_point tVar7;
  _Rb_tree<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>,std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>,std::_Identity<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>>,TxOrphanage::IteratorComparator,std::allocator<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>>>
  *this_00;
  Logger *pLVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  CTxIn *txin;
  pointer __k_00;
  Txid *this_01;
  long in_FS_OFFSET;
  bool bVar9;
  string_view str;
  string_view str_00;
  string_view logging_function;
  string_view logging_function_00;
  pair<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_bool>
  pVar10;
  uint sz;
  string log_msg;
  unsigned_long *in_stack_fffffffffffffe80;
  size_t local_148;
  size_t local_140;
  undefined1 local_138 [24];
  undefined1 local_120 [16];
  undefined1 local_110 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  string local_d8 [4];
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  peVar2 = (tx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  __k = &peVar2->m_witness_hash;
  cVar6 = std::
          _Rb_tree<transaction_identifier<true>,_std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>,_std::_Select1st<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::less<transaction_identifier<true>_>,_std::allocator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>
          ::find((_Rb_tree<transaction_identifier<true>,_std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>,_std::_Select1st<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::less<transaction_identifier<true>_>,_std::allocator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>
                  *)this,__k);
  if ((_Rb_tree_header *)cVar6._M_node != &(this->m_orphans)._M_t._M_impl.super__Rb_tree_header) {
    bVar9 = false;
    goto LAB_00ad7b07;
  }
  this_01 = &peVar2->hash;
  tx_00 = (tx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_58._M_dataplus._M_p = (pointer)0x0;
  local_120._0_8_ = &::TX_NO_WITNESS;
  local_120._8_8_ = &local_58;
  SerializeTransaction<ParamsStream<SizeComputer&,TransactionSerParams>,CTransaction>
            (tx_00,(ParamsStream<SizeComputer_&,_TransactionSerParams> *)local_120,&::TX_NO_WITNESS)
  ;
  iVar4 = (int)local_58._M_dataplus._M_p * 3;
  local_58._M_dataplus._M_p = (pointer)0x0;
  local_120._0_8_ = &::TX_WITH_WITNESS;
  local_120._8_8_ = &local_58;
  SerializeTransaction<ParamsStream<SizeComputer&,TransactionSerParams>,CTransaction>
            (tx_00,(ParamsStream<SizeComputer_&,_TransactionSerParams> *)local_120,
             &::TX_WITH_WITNESS);
  local_138._0_4_ = iVar4 + (int)local_58._M_dataplus._M_p;
  bVar9 = (uint)local_138._0_4_ < 0x61a81;
  if (bVar9) {
    local_120._0_8_ =
         (tx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    local_120._8_8_ =
         (tx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
    if ((string *)local_120._8_8_ != (string *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&((string *)local_120._8_8_)->_M_string_length =
             (int)((string *)local_120._8_8_)->_M_string_length + 1;
        UNLOCK();
      }
      else {
        *(int *)&((string *)local_120._8_8_)->_M_string_length =
             (int)((string *)local_120._8_8_)->_M_string_length + 1;
      }
    }
    local_110._0_8_ = peer;
    tVar7 = NodeClock::now();
    local_110._8_8_ = (long)tVar7.__d.__r / 1000000000 + 0x4b0;
    local_110._16_8_ =
         (long)(this->m_orphan_list).
               super__Vector_base<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)(this->m_orphan_list).
               super__Vector_base<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start >> 3;
    pVar10 = std::
             _Rb_tree<transaction_identifier<true>,std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>,std::_Select1st<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>,std::less<transaction_identifier<true>>,std::allocator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>>
             ::_M_emplace_unique<transaction_identifier<true>const&,TxOrphanage::OrphanTx>
                       ((_Rb_tree<transaction_identifier<true>,std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>,std::_Select1st<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>,std::less<transaction_identifier<true>>,std::allocator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>>
                         *)this,__k,(OrphanTx *)local_120);
    local_138._8_8_ = pVar10.first._M_node;
    local_138[0x10] = pVar10.second;
    if ((string *)local_120._8_8_ != (string *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_120._8_8_);
      pVar10.second = (bool)local_138[0x10];
      pVar10.first._M_node = (_Base_ptr)local_138._8_8_;
      pVar10._9_7_ = 0;
    }
    local_138._8_8_ = pVar10.first._M_node;
    if (((undefined1  [16])pVar10 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
      __assert_fail("ret.second",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/txorphanage.cpp"
                    ,0x25,"bool TxOrphanage::AddTx(const CTransactionRef &, NodeId)");
    }
    __position._M_current =
         (this->m_orphan_list).
         super__Vector_base<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->m_orphan_list).
        super__Vector_base<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>,std::allocator<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>>>
      ::
      _M_realloc_insert<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>const&>
                ((vector<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>,std::allocator<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>>>
                  *)&this->m_orphan_list,__position,
                 (_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>
                  *)(local_138 + 8));
    }
    else {
      (__position._M_current)->_M_node = (_Base_ptr)local_138._8_8_;
      pp_Var1 = &(this->m_orphan_list).
                 super__Vector_base<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *pp_Var1 = *pp_Var1 + 1;
    }
    peVar2 = (tx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    __k_00 = (peVar2->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_start;
    pCVar3 = (peVar2->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (__k_00 != pCVar3) {
      do {
        this_00 = (_Rb_tree<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>,std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>,std::_Identity<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>>,TxOrphanage::IteratorComparator,std::allocator<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>>>
                   *)std::
                     map<COutPoint,_std::set<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_TxOrphanage::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_std::set<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>,_TxOrphanage::IteratorComparator,_std::allocator<std::_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>_>_>_>_>_>
                     ::operator[](&this->m_outpoint_to_orphan_it,&__k_00->prevout);
        std::
        _Rb_tree<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>,std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>,std::_Identity<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>>,TxOrphanage::IteratorComparator,std::allocator<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>>>
        ::
        _M_insert_unique<std::_Rb_tree_iterator<std::pair<transaction_identifier<true>const,TxOrphanage::OrphanTx>>const&>
                  (this_00,(_Rb_tree_iterator<std::pair<const_transaction_identifier<true>,_TxOrphanage::OrphanTx>_>
                            *)(local_138 + 8));
        __k_00 = __k_00 + 1;
      } while (__k_00 != pCVar3);
    }
    pLVar8 = LogInstance();
    bVar5 = BCLog::Logger::WillLogCategoryLevel(pLVar8,TXPACKAGES,Debug);
    if (!bVar5) goto LAB_00ad7b07;
    base_blob<256u>::ToString_abi_cxx11_(local_d8,this_01);
    base_blob<256u>::ToString_abi_cxx11_((string *)(local_110 + 0x18),__k);
    local_140 = (this->m_orphans)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    local_148 = (this->m_outpoint_to_orphan_it)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    pLVar8 = LogInstance();
    bVar5 = BCLog::Logger::Enabled(pLVar8);
    if (bVar5) {
      local_120._0_8_ = local_120 + 0x10;
      local_120._8_8_ = (string *)0x0;
      local_110._0_8_ = local_110._0_8_ & 0xffffffffffffff00;
      tinyformat::
      format<std::__cxx11::string,std::__cxx11::string,unsigned_int,unsigned_long,unsigned_long>
                (&local_58,
                 (tinyformat *)"stored orphan tx %s (wtxid=%s), weight: %u (mapsz %u outsz %u)\n",
                 (char *)local_d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_110 + 0x18),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138,
                 (uint *)&local_140,&local_148,in_stack_fffffffffffffe80);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120,
                 &local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      pLVar8 = LogInstance();
      local_58._M_dataplus._M_p = &DAT_00000058;
      local_58._M_string_length = 0xfd88d0;
      source_file_00._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/txorphanage.cpp"
      ;
      source_file_00._M_len = 0x58;
      str_00._M_str = (char *)local_120._0_8_;
      str_00._M_len = local_120._8_8_;
      logging_function_00._M_str = "AddTx";
      logging_function_00._M_len = 5;
      BCLog::Logger::LogPrintStr
                (pLVar8,str_00,logging_function_00,source_file_00,0x2c,TXPACKAGES,Debug);
LAB_00ad7fa9:
      if ((element_type *)local_120._0_8_ != (element_type *)(local_120 + 0x10)) {
        operator_delete((void *)local_120._0_8_,local_110._0_8_ + 1);
      }
    }
  }
  else {
    pLVar8 = LogInstance();
    bVar5 = BCLog::Logger::WillLogCategoryLevel(pLVar8,TXPACKAGES,Debug);
    if (!bVar5) goto LAB_00ad7b07;
    base_blob<256u>::ToString_abi_cxx11_(local_d8,this_01);
    base_blob<256u>::ToString_abi_cxx11_((string *)(local_110 + 0x18),__k);
    pLVar8 = LogInstance();
    bVar5 = BCLog::Logger::Enabled(pLVar8);
    if (bVar5) {
      local_120._0_8_ = local_120 + 0x10;
      local_120._8_8_ = (string *)0x0;
      local_110._0_8_ = local_110._0_8_ & 0xffffffffffffff00;
      tinyformat::format<unsigned_int,std::__cxx11::string,std::__cxx11::string>
                (&local_58,
                 (tinyformat *)"ignoring large orphan tx (size: %u, txid: %s, wtxid: %s)\n",
                 local_138,(uint *)local_d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_110 + 0x18),in_R9);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120,
                 &local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._M_dataplus._M_p != &local_58.field_2) {
        operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
      }
      pLVar8 = LogInstance();
      local_58._M_dataplus._M_p = &DAT_00000058;
      local_58._M_string_length = 0xfd88d0;
      source_file._M_str =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/txorphanage.cpp"
      ;
      source_file._M_len = 0x58;
      str._M_str = (char *)local_120._0_8_;
      str._M_len = local_120._8_8_;
      logging_function._M_str = "AddTx";
      logging_function._M_len = 5;
      BCLog::Logger::LogPrintStr(pLVar8,str,logging_function,source_file,0x20,TXPACKAGES,Debug);
      goto LAB_00ad7fa9;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._24_8_ != &local_e8) {
    operator_delete((void *)local_110._24_8_,local_e8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8[0]._M_dataplus._M_p != &local_d8[0].field_2) {
    operator_delete(local_d8[0]._M_dataplus._M_p,local_d8[0].field_2._M_allocated_capacity + 1);
  }
LAB_00ad7b07:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar9;
}

Assistant:

bool TxOrphanage::AddTx(const CTransactionRef& tx, NodeId peer)
{
    const Txid& hash = tx->GetHash();
    const Wtxid& wtxid = tx->GetWitnessHash();
    if (m_orphans.count(wtxid))
        return false;

    // Ignore big transactions, to avoid a
    // send-big-orphans memory exhaustion attack. If a peer has a legitimate
    // large transaction with a missing parent then we assume
    // it will rebroadcast it later, after the parent transaction(s)
    // have been mined or received.
    // 100 orphans, each of which is at most 100,000 bytes big is
    // at most 10 megabytes of orphans and somewhat more byprev index (in the worst case):
    unsigned int sz = GetTransactionWeight(*tx);
    if (sz > MAX_STANDARD_TX_WEIGHT)
    {
        LogDebug(BCLog::TXPACKAGES, "ignoring large orphan tx (size: %u, txid: %s, wtxid: %s)\n", sz, hash.ToString(), wtxid.ToString());
        return false;
    }

    auto ret = m_orphans.emplace(wtxid, OrphanTx{tx, peer, Now<NodeSeconds>() + ORPHAN_TX_EXPIRE_TIME, m_orphan_list.size()});
    assert(ret.second);
    m_orphan_list.push_back(ret.first);
    for (const CTxIn& txin : tx->vin) {
        m_outpoint_to_orphan_it[txin.prevout].insert(ret.first);
    }

    LogDebug(BCLog::TXPACKAGES, "stored orphan tx %s (wtxid=%s), weight: %u (mapsz %u outsz %u)\n", hash.ToString(), wtxid.ToString(), sz,
             m_orphans.size(), m_outpoint_to_orphan_it.size());
    return true;
}